

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

void __thiscall Js::FunctionBody::ResetProfileIds(FunctionBody *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  WriteBarrierPtr<Js::FunctionCodeGenRuntimeData> *pWVar4;
  
  if ((this->dynamicProfileInfo).ptr != (DynamicProfileInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x19eb,"(!HasDynamicProfileInfo())","!HasDynamicProfileInfo()");
    if (!bVar2) goto LAB_006d4841;
    *puVar3 = 0;
  }
  pWVar4 = FunctionProxy::
           GetAuxPtr<(Js::FunctionProxy::AuxPointerType)11,Memory::WriteBarrierPtr<Js::FunctionCodeGenRuntimeData>*>
                     ((FunctionProxy *)this);
  if (pWVar4 != (WriteBarrierPtr<Js::FunctionCodeGenRuntimeData> *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x19ec,"(!this->GetCodeGenRuntimeData())",
                                "!this->GetCodeGenRuntimeData()");
    if (!bVar2) {
LAB_006d4841:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  this->profiledReturnTypeCount = 0;
  this->profiledSlotCount = 0;
  this->profiledLdLenCount = 0;
  this->profiledLdElemCount = 0;
  this->profiledStElemCount = 0;
  this->profiledCallSiteCount = 0;
  this->profiledArrayCallSiteCount = 0;
  return;
}

Assistant:

void FunctionBody::ResetProfileIds()
    {
#if ENABLE_PROFILE_INFO
        Assert(!HasDynamicProfileInfo()); // profile data relies on the profile ID counts; it should not have been created yet
        Assert(!this->GetCodeGenRuntimeData()); // relies on 'profiledCallSiteCount'

        profiledCallSiteCount = 0;
        profiledArrayCallSiteCount = 0;
        profiledReturnTypeCount = 0;
        profiledSlotCount = 0;
        profiledLdLenCount = 0;
        profiledLdElemCount = 0;
        profiledStElemCount = 0;
#endif
    }